

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

PropertyId
Js::TPropertyKey_GetUpdateSideEffectPropertyId<Js::JavascriptString*>
          (PropertyId propertyId,JavascriptString *propertyKey)

{
  bool bVar1;
  JavascriptString *propertyKey_local;
  PropertyId propertyId_local;
  
  propertyKey_local._4_4_ = propertyId;
  if (propertyId == -1) {
    bVar1 = BuiltInPropertyRecord<8>::Equals
                      ((BuiltInPropertyRecord<8> *)BuiltInPropertyRecords::valueOf,propertyKey);
    if (bVar1) {
      propertyKey_local._4_4_ = 0x18e;
    }
    else {
      bVar1 = BuiltInPropertyRecord<9>::Equals
                        ((BuiltInPropertyRecord<9> *)BuiltInPropertyRecords::toString,propertyKey);
      if (bVar1) {
        propertyKey_local._4_4_ = 0x178;
      }
      else {
        propertyKey_local._4_4_ = -1;
      }
    }
  }
  return propertyKey_local._4_4_;
}

Assistant:

PropertyId TPropertyKey_GetUpdateSideEffectPropertyId<JavascriptString *>(PropertyId propertyId, JavascriptString * propertyKey)
    {
        if (propertyId != Js::Constants::NoProperty)
        {
            return propertyId;
        }
        if (BuiltInPropertyRecords::valueOf.Equals(propertyKey))
        {
            return PropertyIds::valueOf;
        }
        if (BuiltInPropertyRecords::toString.Equals(propertyKey))
        {
           return PropertyIds::toString;
        }
        return Js::Constants::NoProperty;
    }